

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::
unordered_flat_set<std::pair<unsigned_int,unsigned_int>,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
::insert<std::pair<unsigned_int,unsigned_int>const*>
          (unordered_flat_set<std::pair<unsigned_int,unsigned_int>,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
           *this,pair<unsigned_int,_unsigned_int> *first,pair<unsigned_int,_unsigned_int> *last)

{
  char *pcVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong pos0;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  locator res;
  locator local_48;
  
  if (first != last) {
    do {
      auVar13 = ZEXT416(first->first) * ZEXT816(0x9e3779b97f4a7c15);
      uVar4 = (auVar13._8_8_ ^ auVar13._0_8_) + 0x9e3779b9;
      auVar13 = ZEXT416(first->second) * ZEXT816(0x9e3779b97f4a7c15);
      uVar4 = (auVar13._8_8_ ^ auVar13._0_8_) + 0x9e3779b9 + uVar4 * 0x40 + (uVar4 >> 2) ^ uVar4;
      pos0 = uVar4 >> ((byte)*this & 0x3f);
      uVar2 = (&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
                match_word(unsigned_long)::word)[uVar4 & 0xff];
      uVar8 = 0;
      uVar7 = pos0;
      do {
        pcVar1 = (char *)(*(long *)(this + 0x10) + uVar7 * 0x10);
        cVar9 = (char)uVar2;
        auVar13[0] = -(*pcVar1 == cVar9);
        cVar10 = (char)((uint)uVar2 >> 8);
        auVar13[1] = -(pcVar1[1] == cVar10);
        cVar11 = (char)((uint)uVar2 >> 0x10);
        auVar13[2] = -(pcVar1[2] == cVar11);
        bVar12 = (byte)((uint)uVar2 >> 0x18);
        auVar13[3] = -(pcVar1[3] == bVar12);
        auVar13[4] = -(pcVar1[4] == cVar9);
        auVar13[5] = -(pcVar1[5] == cVar10);
        auVar13[6] = -(pcVar1[6] == cVar11);
        auVar13[7] = -(pcVar1[7] == bVar12);
        auVar13[8] = -(pcVar1[8] == cVar9);
        auVar13[9] = -(pcVar1[9] == cVar10);
        auVar13[10] = -(pcVar1[10] == cVar11);
        auVar13[0xb] = -(pcVar1[0xb] == bVar12);
        auVar13[0xc] = -(pcVar1[0xc] == cVar9);
        auVar13[0xd] = -(pcVar1[0xd] == cVar10);
        auVar13[0xe] = -(pcVar1[0xe] == cVar11);
        auVar13[0xf] = -(pcVar1[0xf] == bVar12);
        uVar5 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
        if (uVar5 != 0) {
          lVar6 = *(long *)(this + 0x18) + uVar7 * 0x78;
          do {
            uVar3 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            if ((first->first == *(uint *)(lVar6 + (ulong)uVar3 * 8)) &&
               (first->second == *(uint *)(lVar6 + 4 + (ulong)uVar3 * 8))) goto LAB_001e8491;
            uVar5 = uVar5 - 1 & uVar5;
          } while (uVar5 != 0);
        }
        if (((&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
               is_not_overflowed(unsigned_long)::shift)[(uint)uVar4 & 7] & pcVar1[0xf]) == 0) break;
        lVar6 = uVar7 + uVar8;
        uVar8 = uVar8 + 1;
        uVar7 = lVar6 + 1U & *(ulong *)(this + 8);
      } while (uVar8 <= *(ulong *)(this + 8));
      if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x20)) {
        detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::nosize_unchecked_emplace_at<std::pair<unsigned_int,unsigned_int>const&>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)this,(arrays_type *)this,pos0,uVar4,first);
        *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
      }
      else {
        detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::unchecked_emplace_with_rehash<std::pair<unsigned_int,unsigned_int>const&>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)this,uVar4,first);
      }
LAB_001e8491:
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

void insert(InputIterator first, InputIterator last) {
        for (auto pos = first; pos != last; ++pos) {
            table_.emplace(*pos);
        }
    }